

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O0

void transform_reduce_sum<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  code *pcVar1;
  ulong uVar2;
  byte extraout_AL;
  size_type sVar3;
  iterator **__stat_loc;
  double __x;
  Expression_lhs<const_int_&> EVar4;
  ResultBuilder DOCTEST_RB;
  Task ptask;
  Task stask;
  iterator end;
  iterator beg;
  int sol;
  int sum;
  size_t c;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<int> *__range2;
  size_t n;
  vector<Data,_std::allocator<Data>_> vec;
  Taskflow taskflow;
  Executor executor;
  Result *in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc0;
  Enum in_stack_fffffffffffffbc4;
  Executor *in_stack_fffffffffffffbc8;
  int line;
  allocator_type *in_stack_fffffffffffffbd0;
  size_type in_stack_fffffffffffffbd8;
  undefined1 *puVar5;
  Enum at;
  Taskflow *in_stack_fffffffffffffbe0;
  ResultBuilder *this;
  Executor *this_00;
  anon_class_40_5_33a24316 *c_00;
  Executor *in_stack_fffffffffffffc08;
  ExpressionDecomposer local_3e4;
  Executor *local_3e0;
  Enum local_3d8;
  int *in_stack_fffffffffffffc40;
  Expression_lhs<const_int_&> *in_stack_fffffffffffffc48;
  undefined8 in_stack_fffffffffffffca8;
  size_t in_stack_fffffffffffffcb0;
  Executor *in_stack_fffffffffffffcb8;
  __basic_future<void> local_338 [2];
  undefined8 local_318;
  __normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *local_300;
  __normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *local_2f8;
  FlowBuilder local_2f0;
  Task local_2e8;
  Data **local_2e0;
  undefined1 *local_2d8;
  Data **local_2d0;
  ulong *local_2c8;
  undefined4 *local_2c0;
  Data *local_2b0;
  Data *local_2a8;
  undefined4 local_2a0;
  undefined4 local_29c;
  long local_298;
  int *local_290;
  int *local_288;
  int local_27c [5];
  initializer_list<int> local_268;
  initializer_list<int> *local_258;
  ulong local_250;
  undefined1 local_241 [25];
  ResultBuilder local_228;
  anon_class_40_5_33a24316 local_150 [8];
  
  c_00 = local_150;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),in_stack_fffffffffffffbb8
            );
  tf::Executor::Executor
            (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffca8);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x1bb5b6);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffbe0);
  this_00 = (Executor *)local_241;
  std::allocator<Data>::allocator((allocator<Data> *)0x1bb5d7);
  std::vector<Data,_std::allocator<Data>_>::vector
            ((vector<Data,_std::allocator<Data>_> *)in_stack_fffffffffffffbe0,
             in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  std::allocator<Data>::~allocator((allocator<Data> *)0x1bb5fd);
  local_250 = 1;
  do {
    uVar2 = local_250;
    sVar3 = std::vector<Data,_std::allocator<Data>_>::size
                      ((vector<Data,_std::allocator<Data>_> *)(local_241 + 1));
    if (sVar3 <= uVar2) {
      std::vector<Data,_std::allocator<Data>_>::~vector
                ((vector<Data,_std::allocator<Data>_> *)in_stack_fffffffffffffbd0);
      tf::Taskflow::~Taskflow
                ((Taskflow *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
      tf::Executor::~Executor(this_00);
      return;
    }
    local_27c[0] = 0;
    local_27c[1] = 1;
    local_27c[2] = 3;
    local_27c[3] = 7;
    local_27c[4] = 99;
    local_268._M_array = local_27c;
    local_268._M_len = 5;
    local_258 = &local_268;
    local_288 = std::initializer_list<int>::begin(local_258);
    local_290 = std::initializer_list<int>::end
                          ((initializer_list<int> *)
                           CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
    for (; local_288 != local_290; local_288 = local_288 + 1) {
      local_298 = (long)*local_288;
      local_29c = 100;
      local_2a0 = 100;
      puVar5 = local_241 + 1;
      local_2a8 = (Data *)std::vector<Data,_std::allocator<Data>_>::end
                                    ((vector<Data,_std::allocator<Data>_> *)
                                     in_stack_fffffffffffffbb8);
      local_2b0 = (Data *)std::vector<Data,_std::allocator<Data>_>::end
                                    ((vector<Data,_std::allocator<Data>_> *)
                                     in_stack_fffffffffffffbb8);
      this = &local_228;
      tf::Taskflow::clear((Taskflow *)0x1bb732);
      local_2e0 = &local_2a8;
      local_2d0 = &local_2b0;
      local_2c8 = &local_250;
      local_2c0 = &local_29c;
      local_2d8 = puVar5;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:971:37),_nullptr>
                ((FlowBuilder *)in_stack_fffffffffffffc08,c_00);
      at = (Enum)((ulong)puVar5 >> 0x20);
      tf::Task::Task(&local_2e8);
      local_2f8 = (__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *)
                  std::
                  ref<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>
                            ((__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *
                             )in_stack_fffffffffffffbb8);
      local_300 = (__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *)
                  std::
                  ref<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>
                            ((__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *
                             )in_stack_fffffffffffffbb8);
      tf::GuidedPartitioner<tf::DefaultClosureWrapper>::GuidedPartitioner
                ((GuidedPartitioner<tf::DefaultClosureWrapper> *)
                 CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 (size_t)in_stack_fffffffffffffbb8);
      tf::FlowBuilder::
      transform_reduce<std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:983:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:984:9),_tf::GuidedPartitioner<tf::DefaultClosureWrapper>,_nullptr>
                (&local_2f0,&local_228,local_2f8,local_300,&local_2a0,local_318);
      in_stack_fffffffffffffbd0 = (allocator_type *)&local_2e8;
      tf::Task::operator=((Task *)in_stack_fffffffffffffbd0,(Task *)&local_2f0);
      tf::Task::precede<tf::Task&>
                ((Task *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 (Task *)in_stack_fffffffffffffbb8);
      __stat_loc = &local_150[0].end;
      tf::Executor::run(in_stack_fffffffffffffbc8,
                        (Taskflow *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
      line = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
      std::__basic_future<void>::wait(local_338,__stat_loc);
      tf::Future<void>::~Future
                ((Future<void> *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
      in_stack_fffffffffffffbb8 = (Result *)0x2150c5;
      doctest::detail::ResultBuilder::ResultBuilder
                (this,at,(char *)in_stack_fffffffffffffbd0,line,
                 (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),"",
                 (char *)this_00);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_3e4,DT_REQUIRE);
      EVar4 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                         (int *)in_stack_fffffffffffffbb8);
      in_stack_fffffffffffffbc8 = (Executor *)EVar4.lhs;
      in_stack_fffffffffffffbc4 = EVar4.m_at;
      in_stack_fffffffffffffc08 = in_stack_fffffffffffffbc8;
      local_3e0 = in_stack_fffffffffffffbc8;
      local_3d8 = in_stack_fffffffffffffbc4;
      doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbb8);
      doctest::detail::Result::~Result((Result *)0x1bb946);
      doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffc50,__x);
      in_stack_fffffffffffffbc0 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffffbc0);
      if ((extraout_AL & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::ResultBuilder::react
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1bbab7);
    }
    local_250 = local_250 + 1;
  } while( true );
}

Assistant:

void transform_reduce_sum(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<Data> vec(1000);

  for(size_t n=1; n<vec.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      auto sum = 100;
      auto sol = 100;
      auto beg = vec.end();
      auto end = vec.end();

      taskflow.clear();
      auto stask = taskflow.emplace([&](){
        beg = vec.begin();
        end = vec.begin() + n;
        for(auto itr = beg; itr != end; itr++) {
          sum += itr->get();
        }
      });

      tf::Task ptask;

      ptask = taskflow.transform_reduce(
        std::ref(beg), std::ref(end), sol,
        [] (int l, int r)   { return  l + r; },
        [] (const Data& data) { return data.get(); },
        P(c)
      );

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(sol == sum);
    }
  }
}